

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O2

h__Writer * __thiscall
AS_02::TimedText::MXFWriter::h__Writer::WriteTimedTextResource
          (h__Writer *this,string *XMLDoc,AESEncContext *Ctx,HMACContext *HMAC)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  ulonglong *puVar1;
  ulong uVar2;
  int64_t iVar3;
  ui32_t size;
  IndexEntry index_entry;
  FrameBuffer segment_buffer;
  uint *local_200;
  uint local_1f0;
  FrameBuffer FrameBuf;
  DeltaEntry nil_delta_entry;
  UL local_158 [2];
  string *local_108;
  UUID local_100;
  undefined4 local_d8;
  int64_t local_d0;
  undefined8 local_c8;
  ulong local_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  ulong local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined8 local_87;
  undefined8 uStack_7f;
  vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
  local_70 [8];
  _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
  local_68 [24];
  vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
  local_50 [32];
  
  ASDCP::FrameBuffer::FrameBuffer(&segment_buffer);
  _index_entry = &ASDCP::MXF::TimedTextResourceSubDescriptor::typeinfo;
  ASDCP::MXF::h__WriterState::Goto_RUNNING((h__WriterState *)this);
  if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                    super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                    super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
    uVar2 = *(ulong *)(Ctx + 8);
    size = (ui32_t)uVar2;
    ASDCP::TimedText::FrameBuffer::FrameBuffer(&FrameBuf,size);
    memcpy((void *)CONCAT44(FrameBuf._12_4_,FrameBuf._8_4_),*(void **)Ctx,uVar2 & 0xffffffff);
    this_00 = &XMLDoc->field_2;
    puVar1 = (ulonglong *)(XMLDoc[0x19].field_2._M_local_buf + 8);
    FrameBuf._24_4_ = size;
    ASDCP::Write_EKLV_Packet
              ((FileWriter *)local_158,(Dictionary *)this_00->_M_local_buf,
               (OP1aHeader *)XMLDoc->_M_string_length,(WriterInfo *)&XMLDoc[2].field_2,
               (FrameBuffer *)(XMLDoc[0x1b].field_2._M_local_buf + 8),
               (uint *)&XMLDoc[0x1a]._M_string_length,puVar1,(FrameBuffer *)(XMLDoc + 0x1a),
               (uchar *)&FrameBuf,(uint *)(XMLDoc[0x32].field_2._M_local_buf + 8),
               (AESEncContext *)&ASDCP::MXF_BER_LENGTH,HMAC);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_158);
    Kumu::Result_t::~Result_t((Result_t *)local_158);
    ASDCP::TimedText::FrameBuffer::~FrameBuffer(&FrameBuf);
    if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                      super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                      super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
      _nil_delta_entry = (undefined **)std::_Rb_tree_insert_and_rebalance;
      ASDCP::MXF::IndexTableSegment::IndexTableSegment
                ((IndexTableSegment *)local_158,(Dictionary *)XMLDoc->_M_string_length);
      local_108 = XMLDoc + 0x10;
      Kumu::GenRandomValue(&local_100);
      std::
      vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
      ::push_back(local_70,&nil_delta_entry);
      local_a0 = *(undefined8 *)((long)&XMLDoc[0x33]._M_string_length + 4);
      local_98 = 0;
      local_90 = 0xffffffffffffffff;
      std::
      vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
      ::push_back(local_50,&index_entry);
      ASDCP::FrameBuffer::Capacity((uint)&FrameBuf);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&FrameBuf);
      Kumu::Result_t::~Result_t((Result_t *)&FrameBuf);
      if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                        super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                        super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
        ASDCP::MXF::IndexTableSegment::WriteToBuffer(&FrameBuf.super_FrameBuffer);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&FrameBuf);
        Kumu::Result_t::~Result_t((Result_t *)&FrameBuf);
      }
      ASDCP::MXF::IndexTableSegment::~IndexTableSegment((IndexTableSegment *)local_158);
      if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                        super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                        super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
        iVar3 = Kumu::IFileReader::TellPosition((IFileReader *)this_00->_M_local_buf);
        if ((Dictionary *)XMLDoc->_M_string_length == (Dictionary *)0x0) {
          __assert_fail("m_Dict",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                        ,0x22f,
                        "ASDCP::Result_t AS_02::TimedText::MXFWriter::h__Writer::WriteTimedTextResource(const std::string &, ASDCP::AESEncContext *, ASDCP::HMACContext *)"
                       );
        }
        ASDCP::MXF::Partition::Partition
                  ((Partition *)local_158,(Dictionary *)XMLDoc->_M_string_length);
        local_d8 = *(undefined4 *)&XMLDoc[6].field_2;
        local_98 = local_98 & 0xffffffff00000000;
        local_a8 = 0x81;
        local_b0 = (ulong)local_1f0;
        local_c8 = *(undefined8 *)(XMLDoc[0x17].field_2._M_allocated_capacity + 0x20);
        local_88 = *(undefined1 *)&XMLDoc[9]._M_dataplus._M_p;
        local_87 = *(undefined8 *)((long)&XMLDoc[9]._M_dataplus._M_p + 1);
        uStack_7f = *(undefined8 *)((long)&XMLDoc[9]._M_string_length + 1);
        FrameBuf._0_8_ = &PTR__IArchive_00168e48;
        FrameBuf._8_4_ = 0;
        FrameBuf._16_8_ = iVar3;
        local_d0 = iVar3;
        std::__cxx11::
        list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::
        push_back((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                   *)&XMLDoc[0x17]._M_string_length,(value_type *)&FrameBuf);
        std::
        _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
        ::operator=(local_68,(_Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
                              *)(XMLDoc + 10));
        ASDCP::Dictionary::Type((MDD_t)XMLDoc->_M_string_length);
        _nil_delta_entry = &PTR__IArchive_00168cc8;
        ASDCP::MXF::Partition::WriteToFile((FileWriter *)&FrameBuf,local_158);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&FrameBuf);
        Kumu::Result_t::~Result_t((Result_t *)&FrameBuf);
        ASDCP::MXF::Partition::~Partition((Partition *)local_158);
        if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                          super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                          super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
          FrameBuf._0_8_ = FrameBuf._0_8_ & 0xffffffff00000000;
          Kumu::FileWriter::Write((uchar *)local_158,(uint)this_00,local_200);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_158);
          Kumu::Result_t::~Result_t((Result_t *)local_158);
          if (FrameBuf._0_4_ != local_1f0) {
            __assert_fail("write_count == segment_buffer.Size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                          ,0x246,
                          "ASDCP::Result_t AS_02::TimedText::MXFWriter::h__Writer::WriteTimedTextResource(const std::string &, ASDCP::AESEncContext *, ASDCP::HMACContext *)"
                         );
          }
          if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                            super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                            super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
            *(int *)puVar1 = (int)*puVar1 + 1;
          }
        }
      }
    }
  }
  ASDCP::FrameBuffer::~FrameBuffer(&segment_buffer);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFWriter::h__Writer::WriteTimedTextResource(const std::string& XMLDoc,
							       ASDCP::AESEncContext* Ctx, ASDCP::HMACContext* HMAC)
{
  ASDCP::FrameBuffer segment_buffer;
  IndexTableSegment::IndexEntry index_entry;
  Result_t result = m_State.Goto_RUNNING();

  if ( KM_SUCCESS(result) )
    {
      // TODO: make sure it's XML

      ui32_t str_size = XMLDoc.size();
      ASDCP::TimedText::FrameBuffer FrameBuf(str_size);
      
      memcpy(FrameBuf.Data(), XMLDoc.c_str(), str_size);
      FrameBuf.Size(str_size);
      index_entry.StreamOffset = m_StreamOffset;
      
      result = Write_EKLV_Packet(m_File, *m_Dict, m_HeaderPart, m_Info, m_CtFrameBuf, m_FramesWritten,
				 m_StreamOffset, FrameBuf, m_EssenceUL, MXF_BER_LENGTH, Ctx, HMAC);
    }

  if ( KM_SUCCESS(result) )
    {
      // encode the index table
      IndexTableSegment::DeltaEntry nil_delta_entry;
      IndexTableSegment segment(m_Dict);
      segment.m_Lookup = &m_HeaderPart.m_Primer;
      GenRandomValue(segment.InstanceUID);

      segment.DeltaEntryArray.push_back(nil_delta_entry);
      segment.IndexEditRate = m_EditRate;
      segment.IndexStartPosition = 0;
      segment.IndexDuration = -1;
      segment.IndexEntryArray.push_back(index_entry);

      result = segment_buffer.Capacity(MaxIndexSegmentSize); // segment-count * max-segment-size

      if ( KM_SUCCESS(result) )
	{
	  result = segment.WriteToBuffer(segment_buffer);
	}
    }

  if ( KM_SUCCESS(result) )
    {
      // create an index partition header
      Kumu::fpos_t here = m_File.TellPosition();
      assert(m_Dict);

      ASDCP::MXF::Partition partition(m_Dict);
      partition.MajorVersion = m_HeaderPart.MajorVersion;
      partition.MinorVersion = m_HeaderPart.MinorVersion;
      partition.ThisPartition = here;
      partition.BodySID = 0;
      partition.IndexSID = 129;
      partition.IndexByteCount = segment_buffer.Size();
      partition.PreviousPartition = m_RIP.PairArray.back().ByteOffset;
      partition.OperationalPattern = m_HeaderPart.OperationalPattern;

      m_RIP.PairArray.push_back(RIP::PartitionPair(0, here));
      partition.EssenceContainers = m_HeaderPart.EssenceContainers;
      UL TmpUL(m_Dict->ul(MDD_ClosedCompleteBodyPartition));
      result = partition.WriteToFile(m_File, TmpUL);
    }
  
  if ( KM_SUCCESS(result) )
    {
      // write the encoded index table
      ui32_t write_count = 0;
      result = m_File.Write(segment_buffer.RoData(), segment_buffer.Size(), &write_count);
      assert(write_count == segment_buffer.Size());
    }

  if ( KM_SUCCESS(result) )
    {
      m_FramesWritten++;
    }

  return result;
}